

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O0

void test_xonly_pubkey_tweak_recursive(void)

{
  int iVar1;
  int pk_parity;
  secp256k1_xonly_pubkey xonly_pk_1;
  secp256k1_xonly_pubkey xonly_pk;
  int i;
  uchar tweak [31] [32];
  uchar pk_serialized [32];
  secp256k1_pubkey pk [32];
  uchar sk [32];
  uchar *in_stack_fffffffffffff350;
  secp256k1_xonly_pubkey *in_stack_fffffffffffff3a8;
  secp256k1_pubkey *in_stack_fffffffffffff3b0;
  secp256k1_context *in_stack_fffffffffffff3b8;
  secp256k1_xonly_pubkey *in_stack_fffffffffffff3c0;
  secp256k1_context *in_stack_fffffffffffff3c8;
  int local_c2c;
  uchar *in_stack_fffffffffffff3d8;
  secp256k1_pubkey *in_stack_fffffffffffff3e0;
  undefined4 in_stack_fffffffffffff3e8;
  int in_stack_fffffffffffff3ec;
  uchar *in_stack_fffffffffffff3f0;
  secp256k1_context *in_stack_fffffffffffff3f8;
  
  testrand256(in_stack_fffffffffffff350);
  iVar1 = secp256k1_ec_pubkey_create
                    ((secp256k1_context *)
                     CONCAT44(in_stack_fffffffffffff3ec,in_stack_fffffffffffff3e8),
                     in_stack_fffffffffffff3e0,in_stack_fffffffffffff3d8);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modules/extrakeys/tests_impl.h"
            ,0x104,"test condition failed: secp256k1_ec_pubkey_create(CTX, &pk[0], sk) == 1");
    abort();
  }
  local_c2c = 0;
  while( true ) {
    if (0x1e < local_c2c) {
      local_c2c = 0x1f;
      while( true ) {
        if (local_c2c < 1) {
          return;
        }
        iVar1 = secp256k1_xonly_pubkey_from_pubkey
                          (in_stack_fffffffffffff3c8,in_stack_fffffffffffff3c0,
                           (int *)in_stack_fffffffffffff3b8,in_stack_fffffffffffff3b0);
        if (iVar1 != 1) {
          fprintf(_stderr,"%s:%d: %s\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modules/extrakeys/tests_impl.h"
                  ,0x111,
                  "test condition failed: secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, &pk_parity, &pk[i]) == 1"
                 );
          abort();
        }
        iVar1 = secp256k1_xonly_pubkey_serialize
                          (in_stack_fffffffffffff3b8,in_stack_fffffffffffff3b0->data,
                           in_stack_fffffffffffff3a8);
        if (iVar1 != 1) {
          fprintf(_stderr,"%s:%d: %s\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modules/extrakeys/tests_impl.h"
                  ,0x112,
                  "test condition failed: secp256k1_xonly_pubkey_serialize(CTX, pk_serialized, &xonly_pk) == 1"
                 );
          abort();
        }
        iVar1 = secp256k1_xonly_pubkey_from_pubkey
                          (in_stack_fffffffffffff3c8,in_stack_fffffffffffff3c0,
                           (int *)in_stack_fffffffffffff3b8,in_stack_fffffffffffff3b0);
        if (iVar1 != 1) break;
        iVar1 = secp256k1_xonly_pubkey_tweak_add_check
                          (in_stack_fffffffffffff3f8,in_stack_fffffffffffff3f0,
                           in_stack_fffffffffffff3ec,
                           (secp256k1_xonly_pubkey *)in_stack_fffffffffffff3e0,
                           in_stack_fffffffffffff3d8);
        if (iVar1 != 1) {
          fprintf(_stderr,"%s:%d: %s\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modules/extrakeys/tests_impl.h"
                  ,0x114,
                  "test condition failed: secp256k1_xonly_pubkey_tweak_add_check(CTX, pk_serialized, pk_parity, &xonly_pk, tweak[i - 1]) == 1"
                 );
          abort();
        }
        local_c2c = local_c2c + -1;
      }
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modules/extrakeys/tests_impl.h"
              ,0x113,
              "test condition failed: secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, NULL, &pk[i - 1]) == 1"
             );
      abort();
    }
    memset(&stack0xfffffffffffff3d8 + (long)local_c2c * 0x20,local_c2c + 1U & 0xff,0x20);
    iVar1 = secp256k1_xonly_pubkey_from_pubkey
                      (in_stack_fffffffffffff3c8,in_stack_fffffffffffff3c0,
                       (int *)in_stack_fffffffffffff3b8,in_stack_fffffffffffff3b0);
    if (iVar1 != 1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modules/extrakeys/tests_impl.h"
              ,0x109,
              "test condition failed: secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, NULL, &pk[i]) == 1"
             );
      abort();
    }
    iVar1 = secp256k1_xonly_pubkey_tweak_add
                      (in_stack_fffffffffffff3c8,(secp256k1_pubkey *)in_stack_fffffffffffff3c0,
                       (secp256k1_xonly_pubkey *)in_stack_fffffffffffff3b8,
                       in_stack_fffffffffffff3b0->data);
    if (iVar1 != 1) break;
    local_c2c = local_c2c + 1;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/modules/extrakeys/tests_impl.h"
          ,0x10a,
          "test condition failed: secp256k1_xonly_pubkey_tweak_add(CTX, &pk[i + 1], &xonly_pk, tweak[i]) == 1"
         );
  abort();
}

Assistant:

static void test_xonly_pubkey_tweak_recursive(void) {
    unsigned char sk[32];
    secp256k1_pubkey pk[N_PUBKEYS];
    unsigned char pk_serialized[32];
    unsigned char tweak[N_PUBKEYS - 1][32];
    int i;

    testrand256(sk);
    CHECK(secp256k1_ec_pubkey_create(CTX, &pk[0], sk) == 1);
    /* Add tweaks */
    for (i = 0; i < N_PUBKEYS - 1; i++) {
        secp256k1_xonly_pubkey xonly_pk;
        memset(tweak[i], i + 1, sizeof(tweak[i]));
        CHECK(secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, NULL, &pk[i]) == 1);
        CHECK(secp256k1_xonly_pubkey_tweak_add(CTX, &pk[i + 1], &xonly_pk, tweak[i]) == 1);
    }

    /* Verify tweaks */
    for (i = N_PUBKEYS - 1; i > 0; i--) {
        secp256k1_xonly_pubkey xonly_pk;
        int pk_parity;
        CHECK(secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, &pk_parity, &pk[i]) == 1);
        CHECK(secp256k1_xonly_pubkey_serialize(CTX, pk_serialized, &xonly_pk) == 1);
        CHECK(secp256k1_xonly_pubkey_from_pubkey(CTX, &xonly_pk, NULL, &pk[i - 1]) == 1);
        CHECK(secp256k1_xonly_pubkey_tweak_add_check(CTX, pk_serialized, pk_parity, &xonly_pk, tweak[i - 1]) == 1);
    }
}